

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O3

block * gen_portrange(compiler_state_t *cstate,int port1,int port2,int ip_proto,int dir)

{
  block *b0;
  block *b1;
  block *pbVar1;
  
  b0 = gen_linktype(cstate,0x800);
  if (ip_proto < 0x11) {
    if (ip_proto == -1) {
      pbVar1 = gen_portrangeop(cstate,port1,port2,6,dir);
      b1 = gen_portrangeop(cstate,port1,port2,0x11,dir);
      gen_or(pbVar1,b1);
      pbVar1 = gen_portrangeop(cstate,port1,port2,0x84,dir);
      gen_or(pbVar1,b1);
      goto LAB_0010dc1d;
    }
    if (ip_proto != 6) goto LAB_0010dc3a;
  }
  else if ((ip_proto != 0x84) && (ip_proto != 0x11)) {
LAB_0010dc3a:
    abort();
  }
  b1 = gen_portrangeop(cstate,port1,port2,ip_proto,dir);
LAB_0010dc1d:
  gen_and(b0,b1);
  return b1;
}

Assistant:

static struct block *
gen_portrange(compiler_state_t *cstate, int port1, int port2, int ip_proto,
    int dir)
{
	struct block *b0, *b1, *tmp;

	/* link proto ip */
	b0 = gen_linktype(cstate, ETHERTYPE_IP);

	switch (ip_proto) {
	case IPPROTO_UDP:
	case IPPROTO_TCP:
	case IPPROTO_SCTP:
		b1 = gen_portrangeop(cstate, port1, port2, ip_proto, dir);
		break;

	case PROTO_UNDEF:
		tmp = gen_portrangeop(cstate, port1, port2, IPPROTO_TCP, dir);
		b1 = gen_portrangeop(cstate, port1, port2, IPPROTO_UDP, dir);
		gen_or(tmp, b1);
		tmp = gen_portrangeop(cstate, port1, port2, IPPROTO_SCTP, dir);
		gen_or(tmp, b1);
		break;

	default:
		abort();
	}
	gen_and(b0, b1);
	return b1;
}